

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bcp.cc
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_cffe::BlockCopy<sptk::uint24_t>::Run
          (BlockCopy<sptk::uint24_t> *this,istream *input_stream)

{
  int iVar1;
  uint write_size;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  uint uVar5;
  ostream *poVar6;
  size_t *__idx;
  uint8_t *puVar7;
  ulong uVar8;
  uint uVar9;
  uint write_size_00;
  long lVar10;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  longdouble in_ST7;
  ulong local_b0;
  string word;
  vector<sptk::uint24_t,_std::allocator<sptk::uint24_t>_> pad_data;
  vector<sptk::uint24_t,_std::allocator<sptk::uint24_t>_> input_data;
  
  uVar9 = this->input_end_number_ - this->input_start_number_;
  write_size = this->output_start_number_;
  write_size_00 = (~uVar9 - write_size) + this->output_block_length_;
  uVar5 = write_size_00;
  if ((int)write_size_00 < (int)write_size) {
    uVar5 = write_size;
  }
  std::vector<sptk::uint24_t,_std::allocator<sptk::uint24_t>_>::vector
            (&pad_data,(long)(int)uVar5,&this->pad_value_,(allocator_type *)&word);
  std::vector<sptk::uint24_t,_std::allocator<sptk::uint24_t>_>::vector
            (&input_data,(long)this->input_block_length_,(allocator_type *)&word);
  if (this->is_ascii_ == false) {
    do {
      do {
        bVar3 = sptk::ReadStream<sptk::uint24_t>
                          (false,0,0,this->input_block_length_,&input_data,input_stream,(int *)0x0);
        if (!bVar3) goto LAB_00106ad3;
        if (0 < (int)write_size) {
          bVar4 = sptk::WriteStream<sptk::uint24_t>
                            (0,write_size,&pad_data,(ostream *)&std::cout,(int *)0x0);
          if (!bVar4) goto LAB_00106ad3;
        }
        bVar4 = sptk::WriteStream<sptk::uint24_t>
                          (this->input_start_number_,uVar9 + 1,&input_data,(ostream *)&std::cout,
                           (int *)0x0);
        if (!bVar4) goto LAB_00106ad3;
      } while ((int)write_size_00 < 1);
      bVar4 = sptk::WriteStream<sptk::uint24_t>
                        (0,write_size_00,&pad_data,(ostream *)&std::cout,(int *)0x0);
    } while (bVar4);
LAB_00106ad3:
    bVar3 = !bVar3;
  }
  else {
    local_b0 = 0;
    uVar8 = (ulong)write_size;
    if ((int)write_size < 1) {
      uVar8 = local_b0;
    }
    if ((int)write_size_00 < 1) {
      write_size_00 = 0;
    }
    while (bVar3 = true, local_b0 == 0) {
      lVar10 = 0;
      puVar7 = (input_data.super__Vector_base<sptk::uint24_t,_std::allocator<sptk::uint24_t>_>.
                _M_impl.super__Vector_impl_data._M_start)->value + 2;
      do {
        if (this->input_block_length_ <= lVar10) goto LAB_0010695f;
        word._M_dataplus._M_p = (pointer)&word.field_2;
        word._M_string_length = 0;
        word.field_2._M_local_buf[0] = '\0';
        std::operator>>(input_stream,(string *)&word);
        if (word._M_string_length == 0) {
          local_b0 = 1;
          bVar4 = false;
          bVar2 = true;
        }
        else {
          bVar4 = true;
          bVar2 = false;
          if ((this->input_start_number_ <= lVar10) && (lVar10 <= this->input_end_number_)) {
            std::__cxx11::stold((longdouble *)&word,(string *)0x0,__idx);
            iVar1 = (int)ROUND(in_ST0);
            ((uint24_t *)(puVar7 + -2))->value[0] = (uint8_t)iVar1;
            puVar7[-1] = (uint8_t)((uint)iVar1 >> 8);
            *puVar7 = (uint8_t)((uint)iVar1 >> 0x10);
            in_ST0 = in_ST1;
            in_ST1 = in_ST2;
            in_ST2 = in_ST3;
            in_ST3 = in_ST4;
            in_ST4 = in_ST5;
            in_ST5 = in_ST6;
            in_ST6 = in_ST7;
            bVar2 = false;
          }
        }
        std::__cxx11::string::~string((string *)&word);
        lVar10 = lVar10 + 1;
        puVar7 = puVar7 + 3;
      } while (bVar4);
      if (!bVar2) {
        bVar3 = true;
        if (bVar2) {
          bVar3 = false;
        }
        break;
      }
LAB_0010695f:
      if (local_b0 != 0) break;
      for (lVar10 = 0; uVar8 * 3 != lVar10; lVar10 = lVar10 + 3) {
        poVar6 = (ostream *)
                 std::ostream::operator<<
                           (&std::cout,
                            (uint)CONCAT21(*(undefined2 *)
                                            ((pad_data.
                                              super__Vector_base<sptk::uint24_t,_std::allocator<sptk::uint24_t>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->value +
                                            lVar10 + 1),
                                           (pad_data.
                                            super__Vector_base<sptk::uint24_t,_std::allocator<sptk::uint24_t>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->value
                                           [lVar10]));
        std::operator<<(poVar6," ");
      }
      lVar10 = (long)this->input_start_number_;
      puVar7 = input_data.super__Vector_base<sptk::uint24_t,_std::allocator<sptk::uint24_t>_>.
               _M_impl.super__Vector_impl_data._M_start[lVar10].value + 1;
      for (; lVar10 <= this->input_end_number_; lVar10 = lVar10 + 1) {
        *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) =
             0x13;
        poVar6 = (ostream *)
                 std::ostream::operator<<
                           (&std::cout,
                            (uint)CONCAT21(*(undefined2 *)puVar7,
                                           ((uint24_t *)(puVar7 + -1))->value[0]));
        std::operator<<(poVar6," ");
        puVar7 = puVar7 + 3;
      }
      for (lVar10 = 0; (ulong)write_size_00 * 3 != lVar10; lVar10 = lVar10 + 3) {
        poVar6 = (ostream *)
                 std::ostream::operator<<
                           (&std::cout,
                            (uint)CONCAT21(*(undefined2 *)
                                            ((pad_data.
                                              super__Vector_base<sptk::uint24_t,_std::allocator<sptk::uint24_t>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->value +
                                            lVar10 + 1),
                                           (pad_data.
                                            super__Vector_base<sptk::uint24_t,_std::allocator<sptk::uint24_t>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->value
                                           [lVar10]));
        std::operator<<(poVar6," ");
      }
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    }
  }
  std::_Vector_base<sptk::uint24_t,_std::allocator<sptk::uint24_t>_>::~_Vector_base
            (&input_data.super__Vector_base<sptk::uint24_t,_std::allocator<sptk::uint24_t>_>);
  std::_Vector_base<sptk::uint24_t,_std::allocator<sptk::uint24_t>_>::~_Vector_base
            (&pad_data.super__Vector_base<sptk::uint24_t,_std::allocator<sptk::uint24_t>_>);
  return bVar3;
}

Assistant:

bool Run(std::istream* input_stream) const override {
    const int copy_length(input_end_number_ - input_start_number_ + 1);
    const int left_pad_length(output_start_number_);
    const int right_pad_length(output_block_length_ - output_start_number_ -
                               copy_length);

    std::vector<T> pad_data(std::max(left_pad_length, right_pad_length),
                            pad_value_);
    std::vector<T> input_data(input_block_length_);

    if (is_ascii_) {
      T* pads(&(pad_data[0]));
      T* inputs(&(input_data[0]));
      bool halt(false);
      while (!halt) {
        // Read data.
        for (int i(0); i < input_block_length_; ++i) {
          std::string word;
          *input_stream >> word;
          if (word.empty()) {
            halt = true;
            break;
          }
          if (input_start_number_ <= i && i <= input_end_number_) {
            try {
              inputs[i] = static_cast<T>(std::stold(word));
            } catch (std::invalid_argument&) {
              return false;
            }
          }
        }
        if (halt) break;

        // Write data.
        for (int i(0); i < left_pad_length; ++i) {
          std::cout << pads[i] << " ";
        }
        for (int i(input_start_number_); i <= input_end_number_; ++i) {
          std::cout << std::setprecision(
                           std::numeric_limits<long double>::digits10 + 1)
                    << inputs[i] << " ";
        }
        for (int i(0); i < right_pad_length; ++i) {
          std::cout << pads[i] << " ";
        }
        std::cout << std::endl;
      }
    } else {
      while (sptk::ReadStream(false, 0, 0, input_block_length_, &input_data,
                              input_stream, NULL)) {
        if (0 < left_pad_length &&
            !sptk::WriteStream(0, left_pad_length, pad_data, &std::cout,
                               NULL)) {
          return false;
        }
        if (!sptk::WriteStream(input_start_number_, copy_length, input_data,
                               &std::cout, NULL)) {
          return false;
        }
        if (0 < right_pad_length &&
            !sptk::WriteStream(0, right_pad_length, pad_data, &std::cout,
                               NULL)) {
          return false;
        }
      }
    }

    return true;
  }